

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

void __thiscall
unodb::detail::
key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
::cut(key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
      *this,key_prefix_size cut_len)

{
  ulong uVar1;
  byte bVar2;
  key_prefix_size kVar3;
  uint64_t uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  
  iVar5 = (int)CONCAT71(in_register_00000031,cut_len);
  if (iVar5 == 0) {
    __assert_fail("cut_len > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x29d,
                  "void unodb::detail::key_prefix<unodb::detail::basic_art_key<unsigned long>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy>::cut(key_prefix_size) [ArtKey = unodb::detail::basic_art_key<unsigned long>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy]"
                 );
  }
  bVar2 = length(this);
  if (cut_len <= bVar2) {
    uVar1 = *(ulong *)this;
    kVar3 = length(this);
    uVar4 = length_to_word((uint)(byte)(kVar3 - cut_len));
    *(ulong *)this = uVar1 >> ((byte)(iVar5 << 3) & 0x3f) & 0xffffffffffffff | uVar4;
    if (uVar4 >> 0x3b == 0) {
      return;
    }
    __assert_fail("f.key_prefix_length.load() <= key_prefix_capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x2a3,
                  "void unodb::detail::key_prefix<unodb::detail::basic_art_key<unsigned long>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy>::cut(key_prefix_size) [ArtKey = unodb::detail::basic_art_key<unsigned long>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy]"
                 );
  }
  __assert_fail("cut_len <= length()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x29e,
                "void unodb::detail::key_prefix<unodb::detail::basic_art_key<unsigned long>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy>::cut(key_prefix_size) [ArtKey = unodb::detail::basic_art_key<unsigned long>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy]"
               );
}

Assistant:

constexpr void cut(key_prefix_size cut_len) noexcept {
    UNODB_DETAIL_ASSERT(cut_len > 0);
    UNODB_DETAIL_ASSERT(cut_len <= length());

    u64 = ((u64 >> (cut_len * 8)) & key_bytes_mask) |
          length_to_word(static_cast<key_prefix_size>(length() - cut_len));

    UNODB_DETAIL_ASSERT(f.key_prefix_length.load() <= key_prefix_capacity);
  }